

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinChar
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  ostream *poVar1;
  RuntimeError *pRVar2;
  allocator_type *in_RCX;
  ulong uVar3;
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  Value VVar4;
  allocator<char> local_1e1;
  char32_t c;
  _Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  local_1c0;
  stringstream ss;
  ostream local_198 [376];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&ss,"char",&local_1e1);
  c = L'\x02';
  __l._M_len = 1;
  __l._M_array = (iterator)&c;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector((vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
            *)&local_1c0,__l,in_RCX);
  validateBuiltinArgs(this,loc,(string *)&ss,args,
                      (vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                       *)&local_1c0);
  std::
  _Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::~_Vector_base(&local_1c0);
  std::__cxx11::string::~string((string *)&ss);
  uVar3 = (ulong)(((args->
                   super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
                   )._M_impl.super__Vector_impl_data._M_start)->v).d;
  if ((long)uVar3 < 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar1 = std::operator<<(local_198,"codepoints must be >= 0, got ");
    std::ostream::_M_insert<long>((long)poVar1);
    pRVar2 = (RuntimeError *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    Stack::makeError(pRVar2,&this->stack,loc,(string *)&c);
    __cxa_throw(pRVar2,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
  }
  if (uVar3 < 0x110000) {
    c = (char32_t)uVar3;
    _ss = (pointer)local_198;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&ss,&c);
    VVar4 = makeString(this,(UString *)&ss);
    (this->scratch).t = STRING;
    (this->scratch).v = VVar4._0_8_;
    std::__cxx11::u32string::~u32string((u32string *)&ss);
    return (AST *)0x0;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar1 = std::operator<<(local_198,"invalid unicode codepoint, got ");
  std::ostream::_M_insert<long>((long)poVar1);
  pRVar2 = (RuntimeError *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  Stack::makeError(pRVar2,&this->stack,loc,(string *)&c);
  __cxa_throw(pRVar2,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
}

Assistant:

const AST *builtinChar(const LocationRange &loc, const std::vector<Value> &args)
    {
        validateBuiltinArgs(loc, "char", args, {Value::NUMBER});
        long l = long(args[0].v.d);
        if (l < 0) {
            std::stringstream ss;
            ss << "codepoints must be >= 0, got " << l;
            throw makeError(loc, ss.str());
        }
        if (l >= JSONNET_CODEPOINT_MAX) {
            std::stringstream ss;
            ss << "invalid unicode codepoint, got " << l;
            throw makeError(loc, ss.str());
        }
        char32_t c = l;
        scratch = makeString(UString(&c, 1));
        return nullptr;
    }